

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O0

parser<pstore::exchange::import_ns::callbacks> * __thiscall
(anonymous_namespace)::
parse<(pstore::repo::section_kind)0,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          _anonymous_namespace_ *this,string *src,not_null<pstore::database_*> db,
          string_mapping *names,
          back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
          *inserter,not_null<pstore::repo::section_content_*> content)

{
  database *this_00;
  parser<pstore::exchange::import_ns::callbacks> *this_01;
  parser<pstore::exchange::import_ns::callbacks> *this_02;
  undefined1 local_e0 [8];
  parser<pstore::exchange::import_ns::callbacks> parser;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *inserter_local;
  string_mapping *names_local;
  string *src_local;
  not_null<pstore::repo::section_content_*> content_local;
  not_null<pstore::database_*> db_local;
  
  this_02 = __return_storage_ptr__;
  parser.coordinate_ = (coord)names;
  content_local.ptr_ = (section_content *)src;
  this_00 = pstore::gsl::not_null::operator_cast_to_database_((not_null *)&content_local);
  make_json_object_parser<pstore::exchange::import_ns::generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::repo::section_kind,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<pstore::repo::section_content*>,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
            ((parser<pstore::exchange::import_ns::callbacks> *)local_e0,
             (_anonymous_namespace_ *)this_00,(database *)0x0,(section_kind)db.ptr_,
             (string_mapping *)inserter,
             (not_null<pstore::repo::section_content_*>)parser.coordinate_,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)this_02);
  this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_e0,(string *)this);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_01);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (this_02,(parser<pstore::exchange::import_ns::callbacks> *)local_e0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) parse (std::string const & src, not_null<pstore::database *> const db,
                           pstore::exchange::import_ns::string_mapping const & names,
                           OutputIterator * const inserter,                        // out
                           not_null<pstore::repo::section_content *> const content // out
    ) {

        // The type used to store the properties of a section of section-kind Kind.
        using section_type = typename pstore::repo::enum_to_section_t<Kind>;
        // Find the rule that is used to import sections represented by an instance of
        // section_type.
        using section_importer =
            pstore::exchange::import_ns::section_to_importer_t<section_type, OutputIterator>;
        // Create a JSON parser which understands this section object.
        auto parser =
            make_json_object_parser<section_importer> (db, Kind, &names, content, inserter);
        // Parse the string.
        parser.input (src).eof ();
        return parser;
    }